

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_forceNonbasicToBound
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SolRational *sol,int *c,int *maxDimRational,bool toLower)

{
  int iVar1;
  int iVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pNVar3;
  pointer pnVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = (this->_primalDualDiff).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .memused;
  if ((this->_primalDualDiff).
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .memsize <= iVar1) {
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::setMax(&this->_primalDualDiff,*maxDimRational);
  }
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::add(&this->_primalDualDiff,*c);
  iVar2 = *c;
  pNVar3 = (this->_primalDualDiff).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           .m_elem;
  lVar6 = 0x148;
  if (toLower) {
    lVar6 = 0x130;
  }
  lVar5 = *(long *)((long)&(this->_rationalLP->
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           ).
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           .
                           super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                           ._vptr_ClassArray + lVar6);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)(pNVar3 + iVar1),
           (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)((long)iVar2 * 0x40 + lVar5));
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)&pNVar3[iVar1].val.m_backend.m_value.den,
           (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)((long)iVar2 * 0x40 + lVar5 + 0x20));
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator-=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)((this->_primalDualDiff).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   .m_elem + iVar1),
               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)((sol->_primal).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *c));
  lVar5 = (long)*c;
  lVar6 = *(long *)((long)&(this->_rationalLP->
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           ).
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           .
                           super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                           ._vptr_ClassArray + lVar6);
  pnVar4 = (sol->_primal).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)(pnVar4 + lVar5),
           (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)(lVar6 + lVar5 * 0x40));
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)((long)(pnVar4 + lVar5) + 0x20),
           (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)(lVar6 + lVar5 * 0x40 + 0x20));
  return;
}

Assistant:

void SoPlexBase<R>::_forceNonbasicToBound(
   SolRational& sol,
   int& c,
   const int& maxDimRational,
   bool toLower)
{
   int i = _primalDualDiff.size();
   _ensureDSVectorRationalMemory(_primalDualDiff, maxDimRational);
   _primalDualDiff.add(c);

   if(toLower)
      _primalDualDiff.value(i) = lowerRational(c);
   else
      _primalDualDiff.value(i) = upperRational(c);

   _primalDualDiff.value(i) -= sol._primal[c];

   if(toLower)
      sol._primal[c] = lowerRational(c);
   else
      sol._primal[c] = upperRational(c);
}